

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O0

void __thiscall
cppnet::BaseLogger::Info
          (BaseLogger *this,char *file,uint32_t line,char *content,__va_list_tag *list)

{
  char *buf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> list_00;
  bool bVar1;
  uint32_t uVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_40 [8];
  shared_ptr<cppnet::Log> log;
  __va_list_tag *list_local;
  char *content_local;
  uint32_t line_local;
  char *file_local;
  BaseLogger *this_local;
  
  if ((this->_level & 8) != 0) {
    log.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)list;
    GetLog((BaseLogger *)local_40);
    list_00._M_pi =
         log.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    peVar3 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
    buf = peVar3->_log;
    peVar3 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
    uVar2 = FormatLog(file,line,"INF",content,(__va_list_tag *)list_00._M_pi,buf,peVar3->_len);
    peVar3 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
    peVar3->_len = uVar2;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_logger);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_logger);
      (**(code **)(*(long *)peVar4 + 0x18))(peVar4,local_40);
    }
    std::shared_ptr<cppnet::Log>::~shared_ptr((shared_ptr<cppnet::Log> *)local_40);
  }
  return;
}

Assistant:

void BaseLogger::Info(const char* file, uint32_t line, const char* content, va_list list) {
    if (!(_level & LLM_INFO)) {
        return;
    }

    std::shared_ptr<Log> log = GetLog();
    log->_len = FormatLog(file, line, "INF", content, list, log->_log, log->_len);

    if (_logger) {
        _logger->Info(log);
    }
}